

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_uint8_linear_scaled_ABGR(void *outputp,int width_times_channels,float *encode)

{
  undefined8 *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [16];
  float *pfVar11;
  uchar *output;
  undefined8 *puVar12;
  undefined8 *puVar13;
  float *pfVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  auVar10 = _DAT_005ecd50;
  puVar1 = (undefined8 *)((long)outputp + (long)width_times_channels);
  fVar15 = (float)DAT_005ecd50;
  fVar16 = DAT_005ecd50._4_4_;
  fVar17 = DAT_005ecd50._8_4_;
  fVar18 = DAT_005ecd50._12_4_;
  if (width_times_channels < 8) {
    if (3 < width_times_channels) {
      puVar12 = (undefined8 *)((long)outputp + 4);
      do {
        auVar20._0_4_ = encode[3] * fVar18 + 0.5;
        auVar20._4_4_ = encode[2] * fVar17 + 0.5;
        auVar20._8_4_ = encode[1] * fVar16 + 0.5;
        auVar20._12_4_ = *encode * fVar15 + 0.5;
        auVar20 = minps(auVar20,auVar10);
        auVar20 = maxps(auVar20,ZEXT816(0));
        auVar23._0_4_ = (int)auVar20._0_4_;
        auVar23._4_4_ = (int)auVar20._4_4_;
        auVar23._8_4_ = (int)auVar20._8_4_;
        auVar23._12_4_ = (int)auVar20._12_4_;
        auVar20 = packssdw(auVar23,auVar23);
        sVar2 = auVar20._0_2_;
        sVar3 = auVar20._2_2_;
        sVar4 = auVar20._4_2_;
        sVar5 = auVar20._6_2_;
        *(uint *)((long)puVar12 + -4) =
             CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar20[6] - (0xff < sVar5),
                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar20[4] - (0xff < sVar4),
                               CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar20[2] - (0xff < sVar3),
                                        (0 < sVar2) * (sVar2 < 0x100) * auVar20[0] - (0xff < sVar2))
                              ));
        encode = encode + 4;
        puVar12 = (undefined8 *)((long)puVar12 + 4);
      } while (puVar12 <= puVar1);
    }
  }
  else {
    pfVar11 = encode;
    do {
      puVar12 = (undefined8 *)((long)outputp + 8);
      puVar13 = puVar1 + -1;
      if (puVar12 == puVar1) {
        puVar13 = puVar12;
      }
      pfVar14 = encode + (long)width_times_channels + -8;
      if (puVar12 == puVar1) {
        pfVar14 = pfVar11 + 8;
      }
      if (puVar12 <= puVar1 + -1) {
        pfVar14 = pfVar11 + 8;
        puVar13 = puVar12;
      }
      auVar19._0_4_ = pfVar11[3] * fVar18 + 0.5;
      auVar19._4_4_ = pfVar11[2] * fVar17 + 0.5;
      auVar19._8_4_ = pfVar11[1] * fVar16 + 0.5;
      auVar19._12_4_ = *pfVar11 * fVar15 + 0.5;
      auVar22._0_4_ = pfVar11[7] * fVar18 + 0.5;
      auVar22._4_4_ = pfVar11[6] * fVar17 + 0.5;
      auVar22._8_4_ = pfVar11[5] * fVar16 + 0.5;
      auVar22._12_4_ = pfVar11[4] * fVar15 + 0.5;
      auVar20 = minps(auVar19,auVar10);
      auVar23 = minps(auVar22,auVar10);
      auVar20 = maxps(auVar20,ZEXT816(0));
      auVar23 = maxps(auVar23,ZEXT816(0));
      auVar21._0_4_ = (int)auVar20._0_4_;
      auVar21._4_4_ = (int)auVar20._4_4_;
      auVar21._8_4_ = (int)auVar20._8_4_;
      auVar21._12_4_ = (int)auVar20._12_4_;
      auVar24._0_4_ = (int)auVar23._0_4_;
      auVar24._4_4_ = (int)auVar23._4_4_;
      auVar24._8_4_ = (int)auVar23._8_4_;
      auVar24._12_4_ = (int)auVar23._12_4_;
      auVar20 = packssdw(auVar21,auVar24);
      sVar2 = auVar20._0_2_;
      sVar3 = auVar20._2_2_;
      sVar4 = auVar20._4_2_;
      sVar5 = auVar20._6_2_;
      sVar6 = auVar20._8_2_;
      sVar7 = auVar20._10_2_;
      sVar8 = auVar20._12_2_;
      sVar9 = auVar20._14_2_;
      *(ulong *)outputp =
           CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar20[0xe] - (0xff < sVar9),
                    CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar20[0xc] - (0xff < sVar8),
                             CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar20[10] - (0xff < sVar7),
                                      CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar20[8] -
                                               (0xff < sVar6),
                                               CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar20[6] -
                                                        (0xff < sVar5),
                                                        CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                 auVar20[4] - (0xff < sVar4),
                                                                 CONCAT11((0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar20[2] -
                                                                          (0xff < sVar3),
                                                                          (0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar20[0] -
                                                                          (0xff < sVar2))))))));
      pfVar11 = pfVar14;
      outputp = puVar13;
    } while (puVar12 != puVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_linear_scaled )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char *) outputp;
  unsigned char * end_output = ( (unsigned char *) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= stbir__simdfX_float_count*2 )
  {
    float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
    end_output -= stbir__simdfX_float_count*2;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdfX e0, e1;
      stbir__simdi i;
      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdfX_madd_mem( e0, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode );
      stbir__simdfX_madd_mem( e1, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode+stbir__simdfX_float_count );
      stbir__encode_simdfX_unflip( e0 );
      stbir__encode_simdfX_unflip( e1 );
      #ifdef STBIR_SIMD8
      stbir__simdf8_pack_to_16bytes( i, e0, e1 );
      stbir__simdi_store( output, i );
      #else
      stbir__simdf_pack_to_8bytes( i, e0, e1 );
      stbir__simdi_store2( output, i );
      #endif
      encode += stbir__simdfX_float_count*2;
      output += stbir__simdfX_float_count*2;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e0;
    stbir__simdi i0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e0, encode );
    stbir__simdf_madd( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), e0 );
    stbir__encode_simdf4_unflip( e0 );
    stbir__simdf_pack_to_8bytes( i0, e0, e0 );  // only use first 4
    *(int*)(output-4) = stbir__simdi_to_int( i0 );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    stbir__simdf e0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order0 ); output[0] = stbir__simdf_convert_float_to_uint8( e0 );
    #if stbir__coder_min_num >= 2
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order1 ); output[1] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    #if stbir__coder_min_num >= 3
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order2 ); output[2] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  while( output <= end_output )
  {
    float f;
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0-4] = (unsigned char)f;
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1-4] = (unsigned char)f;
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2-4] = (unsigned char)f;
    f = encode[stbir__encode_order3] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[3-4] = (unsigned char)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0] = (unsigned char)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1] = (unsigned char)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2] = (unsigned char)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
  #endif
}